

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# img2webp.c
# Opt level: O1

int main(int argc,char **argv)

{
  char *pcVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  WebPMuxError WVar7;
  WebPImageReader p_Var8;
  WebPAnimEncoder *enc;
  WebPMux *mux;
  uint uVar9;
  uint uVar10;
  long lVar11;
  bool bVar12;
  bool bVar13;
  int parse_error;
  uint32_t features;
  WebPData webp_data;
  WebPAnimEncoderOptions anim_config;
  WebPConfig config;
  CommandLineArguments cmd_args;
  WebPPicture pic;
  WebPMuxAnimParams local_260;
  uint local_254;
  ulong local_250;
  uint local_244;
  WebPAnimEncoder *local_240;
  uint local_234;
  uint local_230;
  uint local_22c;
  size_t local_228;
  char *local_220;
  WebPData local_218;
  ulong local_200;
  WebPAnimEncoderOptions local_1f8;
  WebPConfig local_1cc;
  CommandLineArguments local_158;
  WebPPicture local_130;
  
  uVar2 = ExUtilInitCommandLineArguments(argc + -1,argv + 1,&local_158);
  if (uVar2 == 0) {
    return 1;
  }
  local_250 = (ulong)(uint)local_158.argc_;
  local_218.bytes = (uint8_t *)0x0;
  local_218.size = 0;
  iVar3 = WebPAnimEncoderOptionsInitInternal(&local_1f8,0x109);
  if (((iVar3 == 0) ||
      (iVar3 = WebPConfigInitInternal(&local_1cc,WEBP_PRESET_DEFAULT,75.0,0x210), iVar3 == 0)) ||
     (iVar3 = WebPPictureInitInternal(&local_130,0x210), iVar3 == 0)) {
    main_cold_5();
    local_220 = (char *)0x0;
    enc = (WebPAnimEncoder *)0x0;
    uVar10 = 0;
    local_244 = 0;
  }
  else {
    if ((int)local_250 < 1) {
      local_220 = (char *)0x0;
      bVar13 = true;
      local_244 = 0;
      bVar12 = true;
    }
    else {
      local_240 = (WebPAnimEncoder *)((ulong)local_240 & 0xffffffff00000000);
      iVar3 = 0;
      local_244 = 0;
      local_254 = 0;
      local_220 = (char *)0x0;
      do {
        pcVar1 = local_158.argv_[iVar3];
        if (*pcVar1 == '-') {
          local_260 = (WebPMuxAnimParams)((ulong)local_260 & 0xffffffff00000000);
          iVar4 = strcmp(pcVar1,"-o");
          if (iVar4 == 0) {
            iVar4 = iVar3 + 1;
            if ((int)local_250 <= iVar4) goto LAB_00103be7;
            local_158.argv_[iVar3] = (char *)0x0;
            local_220 = local_158.argv_[iVar4];
            iVar3 = iVar4;
LAB_00103e99:
            uVar2 = (uint)(local_260.bgcolor == 0);
            iVar4 = 4;
            if (local_260.bgcolor == 0) {
              local_158.argv_[iVar3] = (char *)0x0;
              iVar4 = 0;
            }
          }
          else {
LAB_00103be7:
            iVar4 = strcmp(pcVar1,"-kmin");
            if (iVar4 == 0) {
              iVar4 = iVar3 + 1;
              if (iVar4 < (int)local_250) {
                local_158.argv_[iVar3] = (char *)0x0;
                local_1f8.kmin = ExUtilGetInt(local_158.argv_[iVar4],0,(int *)&local_260);
                iVar3 = iVar4;
                goto LAB_00103e99;
              }
            }
            iVar4 = strcmp(pcVar1,"-kmax");
            if (iVar4 == 0) {
              iVar4 = iVar3 + 1;
              if (iVar4 < (int)local_250) {
                local_158.argv_[iVar3] = (char *)0x0;
                local_1f8.kmax = ExUtilGetInt(local_158.argv_[iVar4],0,(int *)&local_260);
                iVar3 = iVar4;
                goto LAB_00103e99;
              }
            }
            iVar4 = strcmp(pcVar1,"-loop");
            if (iVar4 == 0) {
              iVar4 = iVar3 + 1;
              if (iVar4 < (int)local_250) {
                local_158.argv_[iVar3] = (char *)0x0;
                local_244 = ExUtilGetInt(local_158.argv_[iVar4],0,(int *)&local_260);
                iVar3 = iVar4;
                if ((int)local_244 < 0) {
                  fprintf(stderr,"Invalid non-positive loop-count (%d)\n",(ulong)local_244);
                  local_260.bgcolor = 1;
                }
                goto LAB_00103e99;
              }
            }
            iVar4 = strcmp(pcVar1,"-min_size");
            if (iVar4 == 0) {
              local_1f8.minimize_size = 1;
              goto LAB_00103e99;
            }
            iVar4 = strcmp(pcVar1,"-mixed");
            if (iVar4 == 0) {
              local_1f8.allow_mixed = 1;
              local_1cc.lossless = 0;
              goto LAB_00103e99;
            }
            iVar4 = strcmp(pcVar1,"-near_lossless");
            if (iVar4 == 0) {
              iVar4 = iVar3 + 1;
              if (iVar4 < (int)local_250) {
                local_158.argv_[iVar3] = (char *)0x0;
                local_1cc.near_lossless = ExUtilGetInt(local_158.argv_[iVar4],0,(int *)&local_260);
                iVar3 = iVar4;
                goto LAB_00103e99;
              }
            }
            iVar4 = strcmp(pcVar1,"-sharp_yuv");
            if (iVar4 == 0) {
              local_1cc.use_sharp_yuv = 1;
              goto LAB_00103e99;
            }
            iVar4 = strcmp(pcVar1,"-v");
            if (iVar4 == 0) {
              local_254 = 1;
              goto LAB_00103e99;
            }
            iVar4 = strcmp(pcVar1,"-h");
            if ((iVar4 == 0) || (iVar4 = strcmp(pcVar1,"-help"), iVar4 == 0)) {
              Help();
              iVar4 = 1;
            }
            else {
              iVar5 = strcmp(pcVar1,"-version");
              iVar4 = 7;
              if (iVar5 == 0) {
                uVar10 = WebPGetEncoderVersion();
                uVar9 = WebPGetMuxVersion();
                uVar6 = SharpYuvGetVersion();
                printf("WebP Encoder version: %d.%d.%d\nWebP Mux version: %d.%d.%d\n",
                       (ulong)(uVar10 >> 0x10 & 0xff),(ulong)(uVar10 >> 8 & 0xff),
                       (ulong)(uVar10 & 0xff),(ulong)(uVar9 >> 0x10 & 0xff),
                       (ulong)(uVar9 >> 8 & 0xff),uVar9 & 0xff);
                printf("libsharpyuv: %d.%d.%d\n",(ulong)(uVar6 >> 0x18),(ulong)(uVar6 >> 0x10),
                       (ulong)(uVar6 & 0xff));
                iVar4 = 4;
              }
            }
          }
          if ((iVar4 != 0) && (iVar4 != 7)) {
            if (iVar4 != 4) {
              return 0;
            }
            uVar10 = 0;
            enc = (WebPAnimEncoder *)0x0;
            goto LAB_00104478;
          }
        }
        else {
          local_240 = (WebPAnimEncoder *)CONCAT44(local_240._4_4_,1);
        }
        if (uVar2 == 0) break;
        iVar3 = iVar3 + 1;
      } while (iVar3 < (int)local_250);
      bVar12 = (int)local_240 == 0;
      bVar13 = local_254 == 0;
    }
    if (!bVar12) {
      local_1cc.lossless = 1;
      bVar12 = uVar2 != 0;
      if ((int)local_250 < 1 || !bVar12) {
        local_240 = (WebPAnimEncoder *)0x0;
        uVar10 = 0;
        local_254 = 0;
        local_200 = 0;
      }
      else {
        local_22c = 100;
        local_200 = 0;
        uVar9 = 0;
        local_234 = 0;
        local_230 = 0;
        local_254 = 0;
        uVar10 = 0;
        local_240 = (WebPAnimEncoder *)0x0;
        do {
          pcVar1 = local_158.argv_[(int)uVar9];
          if (pcVar1 != (char *)0x0) {
            if (*pcVar1 != '-') {
              iVar3 = WebPValidateConfig(&local_1cc);
              if (iVar3 == 0) {
                main_cold_2();
              }
              else {
                local_130.use_argb = 1;
                local_260.bgcolor = 0;
                local_260.loop_count = 0;
                local_228 = 0;
                iVar3 = ImgIoUtilReadFile(local_158.argv_[(int)uVar9],(uint8_t **)&local_260,
                                          &local_228);
                if (iVar3 != 0) {
                  p_Var8 = WebPGuessImageReader((uint8_t *)local_260,local_228);
                  uVar2 = 0;
                  iVar3 = (*p_Var8)((uint8_t *)local_260,local_228,&local_130,1,(Metadata *)0x0);
                  WebPFree((void *)local_260);
                  enc = local_240;
                  if (iVar3 != 0) {
                    bVar12 = true;
                    if (local_240 == (WebPAnimEncoder *)0x0) {
                      local_230 = local_130.width;
                      local_234 = local_130.height;
                      enc = WebPAnimEncoderNewInternal
                                      (local_130.width,local_130.height,&local_1f8,0x109);
                      bVar12 = enc != (WebPAnimEncoder *)0x0;
                      if (enc == (WebPAnimEncoder *)0x0) {
                        main_cold_1();
                        enc = (WebPAnimEncoder *)0x0;
                        bVar12 = false;
                      }
                    }
                    uVar2 = 0;
                    if (bVar12) {
                      if ((local_230 == local_130.width) && (local_234 == local_130.height)) {
                        uVar2 = WebPAnimEncoderAdd(enc,&local_130,local_254,&local_1cc);
                        if (uVar2 == 0) {
                          uVar2 = 0;
                          fprintf(stderr,"Error while adding frame #%d\n",(ulong)uVar10);
                        }
                      }
                      else {
                        uVar2 = 0;
                        fprintf(stderr,
                                "Frame #%d dimension mismatched! Got %d x %d. Was expecting %d x %d.\n"
                                ,(ulong)uVar10,(ulong)(uint)local_130.width,
                                (ulong)(uint)local_130.height,(ulong)local_230,local_234);
                      }
                    }
                    WebPPictureFree(&local_130);
                    if (uVar2 != 0) {
                      local_240 = enc;
                      if (!bVar13) {
                        fprintf(stderr,"Added frame #%3d at time %4d (file: %s)\n",(ulong)uVar10,
                                (ulong)local_254);
                      }
                      local_254 = local_254 + local_22c;
                      uVar10 = uVar10 + 1;
                      local_200 = (ulong)uVar9;
                      goto LAB_00104273;
                    }
                    goto LAB_00104453;
                  }
                  goto LAB_00104478;
                }
              }
              uVar2 = 0;
              enc = local_240;
              goto LAB_00104478;
            }
            local_260 = (WebPMuxAnimParams)((ulong)local_260 & 0xffffffff00000000);
            iVar3 = strcmp(pcVar1,"-lossy");
            if (iVar3 == 0) {
              if (local_1f8.allow_mixed == 0) {
                local_1cc.lossless = 0;
              }
            }
            else {
              iVar3 = strcmp(pcVar1,"-lossless");
              if (iVar3 == 0) {
                if (local_1f8.allow_mixed == 0) {
                  local_1cc.lossless = 1;
                }
              }
              else {
                iVar3 = strcmp(pcVar1,"-q");
                if (iVar3 == 0) {
                  if ((int)local_250 <= (int)(uVar9 + 1)) goto LAB_00104186;
                  local_1cc.quality =
                       ExUtilGetFloat(local_158.argv_[(int)(uVar9 + 1)],(int *)&local_260);
LAB_001041fd:
                  uVar9 = uVar9 + 1;
                }
                else {
LAB_00104186:
                  iVar3 = strcmp(pcVar1,"-m");
                  if (iVar3 == 0) {
                    if ((int)(uVar9 + 1) < (int)local_250) {
                      local_1cc.method =
                           ExUtilGetInt(local_158.argv_[(int)(uVar9 + 1)],0,(int *)&local_260);
                      goto LAB_001041fd;
                    }
                  }
                  iVar3 = strcmp(pcVar1,"-d");
                  if (iVar3 == 0) {
                    if ((int)(uVar9 + 1) < (int)local_250) {
                      local_22c = ExUtilGetInt(local_158.argv_[(int)(uVar9 + 1)],0,(int *)&local_260
                                              );
                      if ((int)local_22c < 1) {
                        fprintf(stderr,"Invalid negative duration (%d)\n",(ulong)local_22c);
                        local_260.bgcolor = 1;
                      }
                      goto LAB_001041fd;
                    }
                  }
                  iVar3 = strcmp(pcVar1,"-exact");
                  if (iVar3 == 0) {
                    local_1cc.exact = 1;
                  }
                  else {
                    iVar3 = strcmp(pcVar1,"-noexact");
                    if (iVar3 == 0) {
                      local_1cc.exact = 0;
                    }
                    else {
                      local_260.bgcolor = 1;
                      fprintf(stderr,"Unknown option [%s]\n",pcVar1);
                    }
                  }
                }
              }
            }
            uVar2 = (uint)(local_260.bgcolor == 0);
            enc = local_240;
            if (local_260.bgcolor != 0) goto LAB_00104478;
          }
LAB_00104273:
          bVar12 = uVar2 != 0;
          if (uVar2 == 0) break;
          uVar9 = uVar9 + 1;
        } while ((int)uVar9 < (int)local_250);
      }
      if ((int)local_200 + 1 < (int)local_250) {
        lVar11 = (long)(int)local_200;
        local_250 = (ulong)((int)local_250 - 1);
        do {
          if (local_158.argv_[lVar11 + 1] != (char *)0x0) {
            fprintf(stderr,"Warning: unused option [%s]! Frame options go before the input frame.\n"
                   );
          }
          lVar11 = lVar11 + 1;
        } while ((int)local_250 != (int)lVar11);
      }
      enc = local_240;
      bVar13 = false;
      if ((bVar12) &&
         (iVar3 = WebPAnimEncoderAdd(local_240,(WebPPicture *)0x0,local_254,(WebPConfig *)0x0),
         iVar3 != 0)) {
        iVar3 = WebPAnimEncoderAssemble(enc,&local_218);
        bVar13 = iVar3 != 0;
      }
      uVar2 = (uint)bVar13;
      if (bVar13 == false) {
        main_cold_3();
      }
      goto LAB_00104478;
    }
    main_cold_4();
    enc = (WebPAnimEncoder *)0x0;
    uVar10 = 0;
  }
LAB_00104453:
  uVar2 = 0;
LAB_00104478:
  WebPAnimEncoderDelete(enc);
  if ((uVar2 != 0) && (0 < (int)local_244)) {
    mux = WebPMuxCreateInternal(&local_218,1,0x109);
    if (mux == (WebPMux *)0x0) {
      bVar12 = false;
    }
    else {
      WVar7 = WebPMuxGetFeatures(mux,(uint32_t *)&local_228);
      bVar12 = WVar7 == WEBP_MUX_OK;
      if ((bVar12) && (bVar12 = true, (local_228 & 2) != 0)) {
        WVar7 = WebPMuxGetAnimationParams(mux,&local_260);
        bVar12 = WVar7 == WEBP_MUX_OK;
        if (bVar12) {
          local_260.loop_count = local_244;
          WVar7 = WebPMuxSetAnimationParams(mux,&local_260);
          bVar12 = WVar7 == WEBP_MUX_OK;
        }
        if (bVar12) {
          WebPFree(local_218.bytes);
          local_218.bytes = (uint8_t *)0x0;
          local_218.size = 0;
          WVar7 = WebPMuxAssemble(mux,&local_218);
          bVar12 = WVar7 == WEBP_MUX_OK;
        }
        else {
          bVar12 = false;
        }
      }
      WebPMuxDelete(mux);
      if (!bVar12) {
        main_cold_6();
      }
    }
    uVar2 = (uint)bVar12;
  }
  pcVar1 = local_220;
  bVar12 = true;
  if (uVar2 != 0) {
    if (local_220 == (char *)0x0) {
      main_cold_7();
      bVar12 = false;
    }
    else {
      iVar3 = ImgIoUtilWriteFile(local_220,local_218.bytes,local_218.size);
      if (iVar3 != 0) {
        bVar12 = false;
        fprintf(stderr,"output file: %s     ",pcVar1);
      }
    }
  }
  if (!bVar12) {
    fprintf(stderr,"[%d frames, %u bytes].\n",(ulong)uVar10,local_218.size & 0xffffffff);
  }
  WebPFree(local_218.bytes);
  local_218.bytes = (uint8_t *)0x0;
  local_218.size = 0;
  ExUtilDeleteCommandLineArguments(&local_158);
  return (uint)bVar12;
}

Assistant:

int main(int argc, const char* argv[]) {
  const char* output = NULL;
  WebPAnimEncoder* enc = NULL;
  int verbose = 0;
  int pic_num = 0;
  int duration = 100;
  int timestamp_ms = 0;
  int loop_count = 0;
  int width = 0, height = 0;
  WebPAnimEncoderOptions anim_config;
  WebPConfig config;
  WebPPicture pic;
  WebPData webp_data;
  int c;
  int have_input = 0;
  int last_input_index = 0;
  CommandLineArguments cmd_args;
  int ok;

  INIT_WARGV(argc, argv);

  ok = ExUtilInitCommandLineArguments(argc - 1, argv + 1, &cmd_args);
  if (!ok) FREE_WARGV_AND_RETURN(EXIT_FAILURE);

  argc = cmd_args.argc_;
  argv = cmd_args.argv_;

  WebPDataInit(&webp_data);
  if (!WebPAnimEncoderOptionsInit(&anim_config) ||
      !WebPConfigInit(&config) ||
      !WebPPictureInit(&pic)) {
    fprintf(stderr, "Library version mismatch!\n");
    ok = 0;
    goto End;
  }

  // 1st pass of option parsing
  for (c = 0; ok && c < argc; ++c) {
    if (argv[c][0] == '-') {
      int parse_error = 0;
      if (!strcmp(argv[c], "-o") && c + 1 < argc) {
        argv[c] = NULL;
        output = (const char*)GET_WARGV_SHIFTED(argv, ++c);
      } else if (!strcmp(argv[c], "-kmin") && c + 1 < argc) {
        argv[c] = NULL;
        anim_config.kmin = ExUtilGetInt(argv[++c], 0, &parse_error);
      } else if (!strcmp(argv[c], "-kmax") && c + 1 < argc) {
        argv[c] = NULL;
        anim_config.kmax = ExUtilGetInt(argv[++c], 0, &parse_error);
      } else if (!strcmp(argv[c], "-loop") && c + 1 < argc) {
        argv[c] = NULL;
        loop_count = ExUtilGetInt(argv[++c], 0, &parse_error);
        if (loop_count < 0) {
          fprintf(stderr, "Invalid non-positive loop-count (%d)\n", loop_count);
          parse_error = 1;
        }
      } else if (!strcmp(argv[c], "-min_size")) {
        anim_config.minimize_size = 1;
      } else if (!strcmp(argv[c], "-mixed")) {
        anim_config.allow_mixed = 1;
        config.lossless = 0;
      } else if (!strcmp(argv[c], "-near_lossless") && c + 1 < argc) {
        argv[c] = NULL;
        config.near_lossless = ExUtilGetInt(argv[++c], 0, &parse_error);
      } else if (!strcmp(argv[c], "-sharp_yuv")) {
        config.use_sharp_yuv = 1;
      } else if (!strcmp(argv[c], "-v")) {
        verbose = 1;
      } else if (!strcmp(argv[c], "-h") || !strcmp(argv[c], "-help")) {
        Help();
        FREE_WARGV_AND_RETURN(EXIT_SUCCESS);
      } else if (!strcmp(argv[c], "-version")) {
        const int enc_version = WebPGetEncoderVersion();
        const int mux_version = WebPGetMuxVersion();
        const int sharpyuv_version = SharpYuvGetVersion();
        printf("WebP Encoder version: %d.%d.%d\nWebP Mux version: %d.%d.%d\n",
               (enc_version >> 16) & 0xff, (enc_version >> 8) & 0xff,
               enc_version & 0xff, (mux_version >> 16) & 0xff,
               (mux_version >> 8) & 0xff, mux_version & 0xff);
        printf("libsharpyuv: %d.%d.%d\n", (sharpyuv_version >> 24) & 0xff,
               (sharpyuv_version >> 16) & 0xffff, sharpyuv_version & 0xff);
        goto End;
      } else {
        continue;
      }
      ok = !parse_error;
      if (!ok) goto End;
      argv[c] = NULL;   // mark option as 'parsed' during 1st pass
    } else {
      have_input |= 1;
    }
  }
  if (!have_input) {
    fprintf(stderr, "No input file(s) for generating animation!\n");
    ok = 0;
    Help();
    goto End;
  }

  // image-reading pass
  pic_num = 0;
  config.lossless = 1;
  for (c = 0; ok && c < argc; ++c) {
    if (argv[c] == NULL) continue;
    if (argv[c][0] == '-') {    // parse local options
      int parse_error = 0;
      if (!strcmp(argv[c], "-lossy")) {
        if (!anim_config.allow_mixed) config.lossless = 0;
      } else if (!strcmp(argv[c], "-lossless")) {
        if (!anim_config.allow_mixed) config.lossless = 1;
      } else if (!strcmp(argv[c], "-q") && c + 1 < argc) {
        config.quality = ExUtilGetFloat(argv[++c], &parse_error);
      } else if (!strcmp(argv[c], "-m") && c + 1 < argc) {
        config.method = ExUtilGetInt(argv[++c], 0, &parse_error);
      } else if (!strcmp(argv[c], "-d") && c + 1 < argc) {
        duration = ExUtilGetInt(argv[++c], 0, &parse_error);
        if (duration <= 0) {
          fprintf(stderr, "Invalid negative duration (%d)\n", duration);
          parse_error = 1;
        }
      } else if (!strcmp(argv[c], "-exact")) {
        config.exact = 1;
      } else if (!strcmp(argv[c], "-noexact")) {
        config.exact = 0;
      } else {
        parse_error = 1;   // shouldn't be here.
        fprintf(stderr, "Unknown option [%s]\n", argv[c]);
      }
      ok = !parse_error;
      if (!ok) goto End;
      continue;
    }

    if (ok) {
      ok = WebPValidateConfig(&config);
      if (!ok) {
        fprintf(stderr, "Invalid configuration.\n");
        goto End;
      }
    }

    // read next input image
    pic.use_argb = 1;
    ok = ReadImage((const char*)GET_WARGV_SHIFTED(argv, c), &pic);
    last_input_index = c;
    if (!ok) goto End;

    if (enc == NULL) {
      width  = pic.width;
      height = pic.height;
      enc = WebPAnimEncoderNew(width, height, &anim_config);
      ok = (enc != NULL);
      if (!ok) {
        fprintf(stderr, "Could not create WebPAnimEncoder object.\n");
      }
    }

    if (ok) {
      ok = (width == pic.width && height == pic.height);
      if (!ok) {
        fprintf(stderr, "Frame #%d dimension mismatched! "
                        "Got %d x %d. Was expecting %d x %d.\n",
                pic_num, pic.width, pic.height, width, height);
      }
    }

    if (ok) {
      ok = WebPAnimEncoderAdd(enc, &pic, timestamp_ms, &config);
      if (!ok) {
        fprintf(stderr, "Error while adding frame #%d\n", pic_num);
      }
    }
    WebPPictureFree(&pic);
    if (!ok) goto End;

    if (verbose) {
      WFPRINTF(stderr, "Added frame #%3d at time %4d (file: %s)\n",
               pic_num, timestamp_ms, GET_WARGV_SHIFTED(argv, c));
    }
    timestamp_ms += duration;
    ++pic_num;
  }

  for (c = last_input_index + 1; c < argc; ++c) {
    if (argv[c] != NULL) {
      fprintf(stderr, "Warning: unused option [%s]!"
                      " Frame options go before the input frame.\n", argv[c]);
    }
  }

  // add a last fake frame to signal the last duration
  ok = ok && WebPAnimEncoderAdd(enc, NULL, timestamp_ms, NULL);
  ok = ok && WebPAnimEncoderAssemble(enc, &webp_data);
  if (!ok) {
    fprintf(stderr, "Error during final animation assembly.\n");
  }

 End:
  // free resources
  WebPAnimEncoderDelete(enc);

  if (ok && loop_count > 0) {  // Re-mux to add loop count.
    ok = SetLoopCount(loop_count, &webp_data);
  }

  if (ok) {
    if (output != NULL) {
      ok = ImgIoUtilWriteFile(output, webp_data.bytes, webp_data.size);
      if (ok) WFPRINTF(stderr, "output file: %s     ", (const W_CHAR*)output);
    } else {
      fprintf(stderr, "[no output file specified]   ");
    }
  }

  if (ok) {
    fprintf(stderr, "[%d frames, %u bytes].\n",
            pic_num, (unsigned int)webp_data.size);
  }
  WebPDataClear(&webp_data);
  ExUtilDeleteCommandLineArguments(&cmd_args);
  FREE_WARGV_AND_RETURN(ok ? EXIT_SUCCESS : EXIT_FAILURE);
}